

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall
mkvparser::Segment::ParseNext
          (Segment *this,Cluster *pCurr,Cluster **pResult,longlong *pos,long *len)

{
  bool bVar1;
  int iVar2;
  Cluster *pCVar3;
  longlong lVar4;
  long local_a8;
  long status_1;
  longlong unknown_size;
  longlong size;
  longlong id;
  longlong result_1;
  longlong segment_stop;
  long status;
  longlong avail;
  longlong total;
  long result;
  long next_idx;
  long *len_local;
  longlong *pos_local;
  Cluster **pResult_local;
  Cluster *pCurr_local;
  Segment *this_local;
  
  next_idx = (long)len;
  len_local = pos;
  pos_local = (longlong *)pResult;
  pResult_local = (Cluster **)pCurr;
  pCurr_local = (Cluster *)this;
  if (pCurr == (Cluster *)0x0) {
    __assert_fail("pCurr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8b,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  bVar1 = Cluster::EOS(pCurr);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!pCurr->EOS()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8c,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  if (this->m_clusters == (Cluster **)0x0) {
    __assert_fail("m_clusters",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0xa8d,
                  "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                 );
  }
  *pos_local = 0;
  if ((long)pResult_local[2] < 0) {
    if (this->m_pos < 1) {
      __assert_fail("m_pos > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xaac,
                    "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                   );
    }
    iVar2 = (*this->m_pReader->_vptr_IMkvReader[1])(this->m_pReader,&avail,&status);
    this_local = (Segment *)(long)iVar2;
    if (-1 < (long)this_local) {
      if (-1 < avail && avail < status) {
        __assert_fail("(total < 0) || (avail <= total)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                      ,0xab5,
                      "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                     );
      }
      if (this->m_size < 0) {
        local_a8 = -1;
      }
      else {
        local_a8 = this->m_start + this->m_size;
      }
      *len_local = (long)pResult_local[1];
      if ((long)pResult_local[4] < 0) {
        if (status < *len_local + 1) {
          *(undefined8 *)next_idx = 1;
          return -3;
        }
        lVar4 = GetUIntLength(this->m_pReader,*len_local,(long *)next_idx);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (0 < lVar4) {
          return -3;
        }
        if ((-1 < local_a8) && (local_a8 < *len_local + *(long *)next_idx)) {
          return -2;
        }
        if (status < *len_local + *(long *)next_idx) {
          return -3;
        }
        lVar4 = ReadUInt(this->m_pReader,*len_local,(long *)next_idx);
        if (lVar4 != 0x1f43b675) {
          return -1;
        }
        *len_local = *(long *)next_idx + *len_local;
        if (status < *len_local + 1) {
          *(undefined8 *)next_idx = 1;
          return -3;
        }
        lVar4 = GetUIntLength(this->m_pReader,*len_local,(long *)next_idx);
        if (lVar4 < 0) {
          return lVar4;
        }
        if (0 < lVar4) {
          return -3;
        }
        if ((-1 < local_a8) && (local_a8 < *len_local + *(long *)next_idx)) {
          return -2;
        }
        if (status < *len_local + *(long *)next_idx) {
          return -3;
        }
        lVar4 = ReadUInt(this->m_pReader,*len_local,(long *)next_idx);
        if (lVar4 < 0) {
          return lVar4;
        }
        *len_local = *(long *)next_idx + *len_local;
        if (lVar4 == (1L << ((char)*(undefined8 *)next_idx * '\a' & 0x3fU)) + -1) {
          return -2;
        }
        if ((-1 < local_a8) && (local_a8 < lVar4 + *len_local)) {
          return -2;
        }
        *len_local = lVar4 + *len_local;
        if ((-1 < local_a8) && (local_a8 < *len_local)) {
          return -2;
        }
      }
      else {
        *len_local = (long)&pResult_local[4]->m_pSegment + *len_local;
      }
      do {
        this_local = (Segment *)DoParseNext(this,(Cluster **)pos_local,len_local,(long *)next_idx);
      } while (1 < (long)this_local);
    }
  }
  else {
    if (this->m_clusters[(long)pResult_local[2]] != (Cluster *)pResult_local) {
      __assert_fail("m_clusters[pCurr->m_index] == pCurr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                    ,0xa92,
                    "long mkvparser::Segment::ParseNext(const Cluster *, const Cluster *&, long long &, long &)"
                   );
    }
    result = (long)&pResult_local[2]->m_pSegment + 1;
    if (result < this->m_clusterCount) {
      *pos_local = (longlong)this->m_clusters[result];
      this_local = (Segment *)0x0;
    }
    else {
      total = LoadCluster(this,len_local,(long *)next_idx);
      this_local = (Segment *)total;
      if (-1 < total) {
        if (total < 1) {
          pCVar3 = GetLast(this);
          *pos_local = (longlong)pCVar3;
          this_local = (Segment *)0x0;
        }
        else {
          this_local = (Segment *)0x1;
        }
      }
    }
  }
  return (long)this_local;
}

Assistant:

long Segment::ParseNext(const Cluster* pCurr, const Cluster*& pResult,
                        long long& pos, long& len) {
  assert(pCurr);
  assert(!pCurr->EOS());
  assert(m_clusters);

  pResult = 0;

  if (pCurr->m_index >= 0) {  // loaded (not merely preloaded)
    assert(m_clusters[pCurr->m_index] == pCurr);

    const long next_idx = pCurr->m_index + 1;

    if (next_idx < m_clusterCount) {
      pResult = m_clusters[next_idx];
      return 0;  // success
    }

    // curr cluster is last among loaded

    const long result = LoadCluster(pos, len);

    if (result < 0)  // error or underflow
      return result;

    if (result > 0)  // no more clusters
    {
      // pResult = &m_eos;
      return 1;
    }

    pResult = GetLast();
    return 0;  // success
  }

  assert(m_pos > 0);

  long long total, avail;

  long status = m_pReader->Length(&total, &avail);

  if (status < 0)  // error
    return status;

  assert((total < 0) || (avail <= total));

  const long long segment_stop = (m_size < 0) ? -1 : m_start + m_size;

  // interrogate curr cluster

  pos = pCurr->m_element_start;

  if (pCurr->m_element_size >= 0)
    pos += pCurr->m_element_size;
  else {
    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    long long result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long id = ReadUInt(m_pReader, pos, len);

    if (id != libwebm::kMkvCluster)
      return -1;

    pos += len;  // consume ID

    // Read Size

    if ((pos + 1) > avail) {
      len = 1;
      return E_BUFFER_NOT_FULL;
    }

    result = GetUIntLength(m_pReader, pos, len);

    if (result < 0)  // error
      return static_cast<long>(result);

    if (result > 0)  // weird
      return E_BUFFER_NOT_FULL;

    if ((segment_stop >= 0) && ((pos + len) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    if ((pos + len) > avail)
      return E_BUFFER_NOT_FULL;

    const long long size = ReadUInt(m_pReader, pos, len);

    if (size < 0)  // error
      return static_cast<long>(size);

    pos += len;  // consume size field

    const long long unknown_size = (1LL << (7 * len)) - 1;

    if (size == unknown_size)  // TODO: should never happen
      return E_FILE_FORMAT_INVALID;  // TODO: resolve this

    // assert((pCurr->m_size <= 0) || (pCurr->m_size == size));

    if ((segment_stop >= 0) && ((pos + size) > segment_stop))
      return E_FILE_FORMAT_INVALID;

    // Pos now points to start of payload

    pos += size;  // consume payload (that is, the current cluster)
    if (segment_stop >= 0 && pos > segment_stop)
      return E_FILE_FORMAT_INVALID;

    // By consuming the payload, we are assuming that the curr
    // cluster isn't interesting.  That is, we don't bother checking
    // whether the payload of the curr cluster is less than what
    // happens to be available (obtained via IMkvReader::Length).
    // Presumably the caller has already dispensed with the current
    // cluster, and really does want the next cluster.
  }

  // pos now points to just beyond the last fully-loaded cluster

  for (;;) {
    const long status = DoParseNext(pResult, pos, len);

    if (status <= 1)
      return status;
  }
}